

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O2

long __thiscall
glcts::anon_unknown_0::CVBODrawArraysXFBPaused<glcts::(anonymous_namespace)::test_api::ES3>::Run
          (CVBODrawArraysXFBPaused<glcts::(anonymous_namespace)::test_api::ES3> *this)

{
  CallLogWrapper *this_00;
  GLuint *pGVar1;
  TDrawFunction TVar2;
  uint widthTest;
  uint heightTest;
  uint widthRef;
  GLuint GVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  runtime_error *this_01;
  bool extraout_DL;
  size_t i;
  ES3 *this_02;
  CColorArray coords;
  CElementArray elements;
  DrawArraysIndirectCommand indirectArrays;
  undefined4 local_378;
  undefined4 uStack_374;
  undefined4 uStack_370;
  undefined4 uStack_36c;
  undefined4 local_368;
  CColorArray bufferTest;
  CColorArray bufferRef;
  GLchar *varyings [1];
  DIResult result;
  DILogger local_1a0;
  
  coords.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  coords.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  coords.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this_02 = (ES3 *)&DAT_00000004;
  DrawIndirectBase::PrimitiveGen
            ((DrawIndirectBase *)this,4,(this->super_CBasicXFBPausedDef)._drawSizeX,
             (this->super_CBasicXFBPausedDef)._drawSizeY,&coords);
  glcts::(anonymous_namespace)::test_api::ES3::glslVer_abi_cxx11_
            ((string *)&result,this_02,extraout_DL);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                 "\nin vec4 i_vertex;\nout vec4 dataOut;\nvoid main()\n{\n    gl_Position = i_vertex;\n    dataOut = i_vertex;\n}"
                );
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,fixed_sample_locations_values + 1,(allocator<char> *)&bufferRef);
  anon_unknown_0::shaders::fshSimple<glcts::(anonymous_namespace)::test_api::ES3>();
  GVar3 = DrawIndirectBase::CreateProgram
                    ((DrawIndirectBase *)this,(string *)&local_1a0,(string *)&result,
                     (string *)&elements,false);
  (this->super_CBasicXFBPausedDef)._program = GVar3;
  std::__cxx11::string::~string((string *)&elements);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::~string((string *)&local_1a0);
  varyings[0] = "dataOut";
  this_00 = &(this->super_CBasicXFBPausedDef).super_DrawIndirectBase.super_SubcaseBase.
             super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glTransformFeedbackVaryings
            (this_00,(this->super_CBasicXFBPausedDef)._program,1,varyings,0x8c8c);
  glu::CallLogWrapper::glLinkProgram(this_00,(this->super_CBasicXFBPausedDef)._program);
  lVar6 = DrawIndirectBase::CheckProgram
                    ((DrawIndirectBase *)this,(this->super_CBasicXFBPausedDef)._program);
  if (lVar6 == 0) {
    result.status_ = -1;
  }
  else {
    glu::CallLogWrapper::glUseProgram(this_00,(this->super_CBasicXFBPausedDef)._program);
    pGVar1 = &(this->super_CBasicXFBPausedDef)._vbo;
    glu::CallLogWrapper::glGenBuffers(this_00,1,pGVar1);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,*pGVar1);
    glu::CallLogWrapper::glBufferData
              (this_00,0x8892,
               (long)coords.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)coords.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
               coords.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start,0x88e4);
    pGVar1 = &(this->super_CBasicXFBPausedDef)._vao;
    glu::CallLogWrapper::glGenVertexArrays(this_00,1,pGVar1);
    glu::CallLogWrapper::glBindVertexArray(this_00,*pGVar1);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,0,4,0x1406,'\0',0x10,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
    indirectArrays.count = 0;
    indirectArrays.primCount = 0;
    indirectArrays.first = 0;
    indirectArrays.reservedMustBeZero = 0;
    local_378 = 0;
    uStack_374 = 0;
    uStack_370 = 0;
    uStack_36c = 0;
    local_368 = 0;
    result.logger_._0_8_ = (ulong)(uint)result.logger_._4_4_ << 0x20;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&elements,
               (long)coords.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)coords.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4,(value_type_conflict4 *)&result,
               (allocator_type *)&local_1a0);
    for (lVar6 = 0;
        (long)elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start >> 2 != lVar6; lVar6 = lVar6 + 1) {
      elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar6] = (uint)lVar6;
    }
    pGVar1 = &(this->super_CBasicXFBPausedDef)._xfo;
    glu::CallLogWrapper::glGenTransformFeedbacks(this_00,1,pGVar1);
    glu::CallLogWrapper::glBindTransformFeedback(this_00,0x8e22,*pGVar1);
    pGVar1 = &(this->super_CBasicXFBPausedDef)._xfbo;
    glu::CallLogWrapper::glGenBuffers(this_00,1,pGVar1);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c8e,*pGVar1);
    glu::CallLogWrapper::glBufferData(this_00,0x8c8e,0x400,(void *)0x0,0x88e4);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x8c8e,0,*pGVar1);
    glu::CallLogWrapper::glBeginTransformFeedback(this_00,4);
    glu::CallLogWrapper::glPauseTransformFeedback(this_00);
    TVar2 = (this->super_CBasicXFBPausedDef)._drawFunc;
    if (TVar2 == DRAW_ARRAYS) {
      indirectArrays.count =
           (GLuint)((ulong)((long)coords.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)coords.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4);
      indirectArrays.primCount = 1;
      indirectArrays.first = 0;
      indirectArrays.reservedMustBeZero = 0;
      glu::CallLogWrapper::glGenBuffers(this_00,1,(GLuint *)&result);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,result.logger_._0_4_);
      glu::CallLogWrapper::glBufferData(this_00,0x8f3f,0x10,&indirectArrays,0x88e4);
      glu::CallLogWrapper::glDrawArraysIndirect(this_00,4,(void *)0x0);
      glu::CallLogWrapper::glDeleteBuffers(this_00,1,(GLuint *)&result);
    }
    else {
      if (TVar2 != DRAW_ELEMENTS) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"Unknown draw function!");
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_378 = (undefined4)
                  ((ulong)((long)coords.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)coords.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4);
      uStack_374 = 1;
      uStack_370 = 0;
      uStack_36c = 0;
      local_368 = 0;
      pGVar1 = &(this->super_CBasicXFBPausedDef)._ebo;
      glu::CallLogWrapper::glGenBuffers(this_00,1,pGVar1);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8893,*pGVar1);
      glu::CallLogWrapper::glBufferData
                (this_00,0x8893,
                 (long)elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                 elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start,0x88e4);
      glu::CallLogWrapper::glGenBuffers(this_00,1,(GLuint *)&result);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,result.logger_._0_4_);
      glu::CallLogWrapper::glBufferData(this_00,0x8f3f,0x14,&local_378,0x88e4);
      glu::CallLogWrapper::glDrawElementsIndirect(this_00,4,0x1405,(void *)0x0);
      glu::CallLogWrapper::glDeleteBuffers(this_00,1,(GLuint *)&result);
    }
    glu::CallLogWrapper::glResumeTransformFeedback(this_00);
    glu::CallLogWrapper::glEndTransformFeedback(this_00);
    iVar4 = (*((this->super_CBasicXFBPausedDef).super_DrawIndirectBase.super_SubcaseBase.
               super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext[4])();
    iVar4 = *(int *)CONCAT44(extraout_var,iVar4);
    iVar5 = (*((this->super_CBasicXFBPausedDef).super_DrawIndirectBase.super_SubcaseBase.
               super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext[4])();
    result.logger_.null_log_ = true;
    result.logger_._1_7_ = 0x3e4ccccd3dcccc;
    result.logger_.str_.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)0x3f8000003e99999a;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&bufferRef,(long)(iVar4 * *(int *)(CONCAT44(extraout_var_00,iVar5) + 4)),
               (value_type *)&result,(allocator_type *)&local_1a0);
    iVar4 = (*((this->super_CBasicXFBPausedDef).super_DrawIndirectBase.super_SubcaseBase.
               super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext[4])();
    iVar4 = *(int *)CONCAT44(extraout_var_01,iVar4);
    iVar5 = (*((this->super_CBasicXFBPausedDef).super_DrawIndirectBase.super_SubcaseBase.
               super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext[4])();
    iVar5 = *(int *)(CONCAT44(extraout_var_02,iVar5) + 4);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&result,0.0);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&bufferTest,(long)(iVar4 * iVar5),(value_type *)&result,(allocator_type *)&local_1a0)
    ;
    iVar4 = (*((this->super_CBasicXFBPausedDef).super_DrawIndirectBase.super_SubcaseBase.
               super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext[4])();
    iVar4 = *(int *)CONCAT44(extraout_var_03,iVar4);
    iVar5 = (*((this->super_CBasicXFBPausedDef).super_DrawIndirectBase.super_SubcaseBase.
               super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext[4])();
    DrawIndirectBase::ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::ES3>
              ((DrawIndirectBase *)this,0,0,iVar4,*(int *)(CONCAT44(extraout_var_04,iVar5) + 4),
               bufferTest.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    DIResult::DIResult(&result);
    iVar4 = (*((this->super_CBasicXFBPausedDef).super_DrawIndirectBase.super_SubcaseBase.
               super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext[4])();
    widthTest = *(uint *)CONCAT44(extraout_var_05,iVar4);
    iVar4 = (*((this->super_CBasicXFBPausedDef).super_DrawIndirectBase.super_SubcaseBase.
               super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext[4])();
    heightTest = *(uint *)(CONCAT44(extraout_var_06,iVar4) + 4);
    iVar4 = (*((this->super_CBasicXFBPausedDef).super_DrawIndirectBase.super_SubcaseBase.
               super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext[4])();
    widthRef = *(uint *)CONCAT44(extraout_var_07,iVar4);
    iVar4 = (*((this->super_CBasicXFBPausedDef).super_DrawIndirectBase.super_SubcaseBase.
               super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext[4])();
    lVar6 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                      ((DrawIndirectBase *)this,&bufferTest,widthTest,heightTest,&bufferRef,widthRef
                       ,*(uint *)(CONCAT44(extraout_var_08,iVar4) + 4));
    DIResult::sub_result(&local_1a0,&result,lVar6);
    DILogger::~DILogger(&local_1a0);
    DILogger::~DILogger(&result.logger_);
    std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
              (&bufferTest.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
    std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
              (&bufferRef.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  }
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&coords.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  return result.status_;
}

Assistant:

virtual long Run()
	{
		return CBasicXFBPausedDef::Run<api>();
	}